

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_equalsCString_nullptr_fn(int _i)

{
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_ffffffffffffff10;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_equalsCString((AString *)&_ck_x,(char *)0x0);
  if (bVar1 != false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b3,"Assertion \'!AString_equalsCString(&string, ((void*)0))\' failed",0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b3);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b4,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b4);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b4,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b4);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("",(char *)string.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b4);
      if (string.deallocator != (ACUtilsDeallocator)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b4,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"\")","(string).size",string.deallocator,
                          "strlen(\"\")",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b4);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b5,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_AString_reallocCount == (0)",
                          "private_ACUtilsTest_AString_reallocCount",
                          private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b5);
      bVar1 = AString_equalsCString((AString *)0x0,"");
      if (bVar1 != false) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b6,"Assertion \'!AString_equalsCString(((void*)0), \"\")\' failed",0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b6);
      if (private_ACUtilsTest_AString_reallocCount == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8b7);
        bVar1 = AString_equalsCString((AString *)0x0,(char *)0x0);
        if (bVar1 != false) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b8);
          string_00.deallocator = string.deallocator;
          string_00.reallocator = string.reallocator;
          string_00.size = string.size;
          string_00.capacity = string.capacity;
          string_00.buffer = in_stack_ffffffffffffff10;
          private_ACUtilsTest_AString_destructTestString(string_00);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b8,
                          "Assertion \'AString_equalsCString(((void*)0), ((void*)0))\' failed",0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8b7,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtilsTest_AString_reallocCount == (0)",
                        "private_ACUtilsTest_AString_reallocCount",
                        private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8b4,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,"(\"\")",
                    "\"","","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_equalsCString_nullptr)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(&string, nullptr));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(nullptr, ""));
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_equalsCString(nullptr, nullptr));
    private_ACUtilsTest_AString_destructTestString(string);
}